

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream.cpp
# Opt level: O2

void __thiscall YAML::Stream::StreamInUtf16(Stream *this)

{
  CharacterSet CVar1;
  ushort uVar2;
  ulong uVar3;
  byte bVar4;
  unsigned_long ch;
  deque<char,_std::allocator<char>_> *q;
  bool bVar5;
  uchar bytes [2];
  byte local_3a;
  uchar local_39;
  deque<char,_std::allocator<char>_> *local_38;
  
  CVar1 = this->m_charSet;
  local_3a = GetNextByte(this);
  local_39 = GetNextByte(this);
  if (*(int *)(this->m_input + *(long *)(*(long *)this->m_input + -0x18) + 0x20) != 0) {
    return;
  }
  bVar5 = CVar1 == utf16be;
  bVar4 = (&local_3a)[!bVar5] & 0xfc;
  if (bVar4 == 0xdc) {
    ch = 0xfffd;
    q = &this->m_readahead;
  }
  else {
    ch = (unsigned_long)CONCAT11((&local_3a)[!bVar5],(&local_3a)[bVar5]);
    if (bVar4 == 0xd8) {
      local_38 = &this->m_readahead;
      uVar3 = ch;
      do {
        ch = uVar3;
        local_3a = GetNextByte(this);
        local_39 = GetNextByte(this);
        if (*(int *)(this->m_input + *(long *)(*(long *)this->m_input + -0x18) + 0x20) != 0) {
          ch = 0xfffd;
          q = local_38;
          break;
        }
        bVar4 = (&local_3a)[!bVar5] + 0x20;
        uVar2 = CONCAT11((&local_3a)[!bVar5],(&local_3a)[bVar5]);
        if (0xfb < bVar4) {
          ch = (ulong)(uVar2 & 0x3ff) + (ulong)(((uint)ch & 0x3ff) << 10) + 0x10000;
          goto LAB_006accc3;
        }
        QueueUnicodeCodepoint(local_38,0xfffd);
        q = local_38;
        uVar3 = (ulong)uVar2;
      } while (0xf7 < bVar4);
    }
    else {
LAB_006accc3:
      q = &this->m_readahead;
    }
  }
  QueueUnicodeCodepoint(q,ch);
  return;
}

Assistant:

void Stream::StreamInUtf16() const {
  unsigned long ch = 0;
  unsigned char bytes[2];
  int nBigEnd = (m_charSet == utf16be) ? 0 : 1;

  bytes[0] = GetNextByte();
  bytes[1] = GetNextByte();
  if (!m_input.good()) {
    return;
  }
  ch = (static_cast<unsigned long>(bytes[nBigEnd]) << 8) |
       static_cast<unsigned long>(bytes[1 ^ nBigEnd]);

  if (ch >= 0xDC00 && ch < 0xE000) {
    // Trailing (low) surrogate...ugh, wrong order
    QueueUnicodeCodepoint(m_readahead, CP_REPLACEMENT_CHARACTER);
    return;
  }

  if (ch >= 0xD800 && ch < 0xDC00) {
    // ch is a leading (high) surrogate

    // Four byte UTF-8 code point

    // Read the trailing (low) surrogate
    for (;;) {
      bytes[0] = GetNextByte();
      bytes[1] = GetNextByte();
      if (!m_input.good()) {
        QueueUnicodeCodepoint(m_readahead, CP_REPLACEMENT_CHARACTER);
        return;
      }
      unsigned long chLow = (static_cast<unsigned long>(bytes[nBigEnd]) << 8) |
                            static_cast<unsigned long>(bytes[1 ^ nBigEnd]);
      if (chLow < 0xDC00 || chLow >= 0xE000) {
        // Trouble...not a low surrogate.  Dump a REPLACEMENT CHARACTER into the
        // stream.
        QueueUnicodeCodepoint(m_readahead, CP_REPLACEMENT_CHARACTER);

        // Deal with the next UTF-16 unit
        if (chLow < 0xD800 || chLow >= 0xE000) {
          // Easiest case: queue the codepoint and return
          QueueUnicodeCodepoint(m_readahead, ch);
          return;
        }
        // Start the loop over with the new high surrogate
        ch = chLow;
        continue;
      }

      // Select the payload bits from the high surrogate
      ch &= 0x3FF;
      ch <<= 10;

      // Include bits from low surrogate
      ch |= (chLow & 0x3FF);

      // Add the surrogacy offset
      ch += 0x10000;
      break;
    }
  }

  QueueUnicodeCodepoint(m_readahead, ch);
}